

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-hash.c
# Opt level: O1

_Bool Curl_uint_hash_remove(uint_hash *h,uint id)

{
  uint uVar1;
  uint_hash_entry *puVar2;
  uint_hash_entry *puVar3;
  
  if (h->table != (uint_hash_entry **)0x0) {
    puVar2 = (uint_hash_entry *)(h->table + (ulong)id % (ulong)h->slots);
    do {
      puVar3 = puVar2;
      puVar2 = puVar3->next;
      if (puVar2 == (uint_hash_entry *)0x0) {
        return false;
      }
      uVar1 = puVar2->id;
    } while (uVar1 != id);
    puVar3->next = puVar2->next;
    h->size = h->size - 1;
    if (puVar2->value != (void *)0x0) {
      if (h->dtor != (Curl_uint_hash_dtor *)0x0) {
        (*h->dtor)(uVar1,puVar2->value);
      }
      puVar2->value = (void *)0x0;
    }
    (*Curl_cfree)(puVar2);
    if (puVar2 != (uint_hash_entry *)0x0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Curl_uint_hash_remove(struct uint_hash *h, unsigned int id)
{
  DEBUGASSERT(h);
  DEBUGASSERT(h->slots);
  DEBUGASSERT(h->init == CURL_UINTHASHINIT);
  if(h->table) {
    struct uint_hash_entry *he, **he_anchor;

    he_anchor = CURL_UINT_HASH_SLOT_ADDR(h, id);
    while(*he_anchor) {
      he = *he_anchor;
      if(id == he->id) {
        uint_hash_entry_unlink(h, he_anchor, he);
        uint_hash_entry_destroy(h, he);
        return TRUE;
      }
      he_anchor = &he->next;
    }
  }
  return FALSE;
}